

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.h
# Opt level: O3

bool re2::RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,int*>
               (StringPiece *text,RE2 *re,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **a,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **a_1,int **a_2)

{
  bool bVar1;
  int *local_58;
  code *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  code *local_40;
  Arg local_38;
  StringPiece local_28;
  Arg *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_10;
  undefined1 *local_8;
  
  local_8 = (undefined1 *)&local_58;
  local_28.ptr_ = text->ptr_;
  local_28.length_ = text->length_;
  local_38.arg_ = *a;
  local_18 = &local_38;
  local_38.parser_ = Arg::parse_string;
  local_48 = *a_1;
  local_10 = &local_48;
  local_40 = Arg::parse_string;
  local_58 = *a_2;
  local_50 = Arg::parse_int;
  bVar1 = PartialMatchN(&local_28,re,&local_18,3);
  return bVar1;
}

Assistant:

static bool PartialMatch(const StringPiece& text, const RE2& re, A&&... a) {
    return Apply(PartialMatchN, text, re, Arg(std::forward<A>(a))...);
  }